

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objundo(mcmcxdef *mctx,objucxdef *undoctx)

{
  errcxdef *in_RSI;
  ushort sav;
  ushort prv;
  objucxdef *in_stack_00000018;
  mcmcxdef *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  ushort uVar1;
  undefined2 in_stack_ffffffffffffffee;
  
  if (*(short *)((long)&in_RSI->errcxlgc + 6) == *(short *)((long)&in_RSI->errcxlgc + 2)) {
    errsigf(in_RSI,(char *)CONCAT26(in_stack_ffffffffffffffee,
                                    CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)),0
           );
  }
  uVar1 = *(ushort *)((long)&in_RSI->errcxlgc + 6);
  while( true ) {
    if (in_RSI->errcxbuf[(ulong)uVar1 + 0x1c] == '\x03') {
      do {
        obj1undo(in_stack_00000020,in_stack_00000018);
      } while (*(ushort *)((long)&in_RSI->errcxlgc + 2) != uVar1);
      return;
    }
    if (uVar1 == *(ushort *)((long)&in_RSI->errcxlgc + 4)) break;
    uVar1 = *(ushort *)(in_RSI->errcxbuf + (long)(int)(uVar1 + 1) + 0x1c);
  }
  errsigf(in_RSI,(char *)CONCAT26(uVar1,CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                )),0);
}

Assistant:

void objundo(mcmcxdef *mctx, objucxdef *undoctx)
{
    ushort prv;
    ushort sav;

    /* see if there's any more undo information */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);

    /* look for most recent savepoint marker */
    for (prv = undoctx->objucxprv ;; )
    {
        if (undoctx->objucxbuf[prv] == OBJUSAV)
        {
            sav = prv;
            break;
        }
        
        /* if we've reached the tail, there are no more undo records */
        if (prv == undoctx->objucxtail)
            errsig(undoctx->objucxerr, ERR_ICUNDO);

        /* get previous record */
        memcpy(&prv, &undoctx->objucxbuf[prv+1], sizeof(prv));
    }
    
    /* now undo everything until we get to the savepoint */
    do { obj1undo(mctx, undoctx); } while (undoctx->objucxhead != sav);
}